

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.hpp
# Opt level: O2

bool __thiscall
lan::db::append<int>(db *this,db_bit *context,string *name,int value,db_bit_type type)

{
  bool bVar1;
  db_bit *pdVar2;
  db_bit *pdVar3;
  string *name_00;
  string local_70;
  string local_50;
  
  this->data = context;
  if (context->type == Container) {
    pdVar3 = context->lin;
    this->data = pdVar3;
    if (pdVar3 != (db_bit *)0x0) {
      do {
        pdVar2 = pdVar3;
        pdVar3 = pdVar2->nex;
      } while (pdVar2->nex != (db_bit *)0x0);
      this->data = pdVar2;
      pdVar3 = (db_bit *)operator_new(0x50);
      (pdVar3->key)._M_dataplus._M_p = (pointer)&(pdVar3->key).field_2;
      (pdVar3->key)._M_string_length = 0;
      (pdVar3->key).field_2._M_local_buf[0] = '\0';
      pdVar3->data = (void *)0x0;
      pdVar3->pre = (db_bit *)0x0;
      pdVar3->nex = (db_bit *)0x0;
      pdVar3->lin = (db_bit *)0x0;
      pdVar3->con = (db_bit *)0x0;
      pdVar2->nex = pdVar3;
      pdVar3->pre = pdVar2;
      this->data = pdVar3;
      if ((int)type < 9) {
        name_00 = &local_50;
        std::__cxx11::string::string((string *)name_00,(string *)name);
        bVar1 = set_bit<int>(this,context,pdVar3,name_00,type,value);
      }
      else {
        name_00 = &local_70;
        std::__cxx11::string::string((string *)name_00,(string *)name);
        bVar1 = set_bit(this,context,pdVar3,name_00,type);
      }
      std::__cxx11::string::~string((string *)name_00);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool append(lan::db_bit * context, std::string const name, any const value, db_bit_type const type){
            data = context;
            if(data-> type == lan::Container and (data = data->lin)){
                data = get_last_bit(data);
                data->nex = new db_bit; data->nex->pre = data; data = data->nex;
                return ((type < lan::Array) ? set_bit(context, data, name, type, value) : set_bit(context, data, name, type));
            } return false;
        }